

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent)

{
  ImGuiWindow *potential_parent_local;
  ImGuiWindow *window_local;
  
  potential_parent_local = window;
  if (window->RootWindow == potential_parent) {
    window_local._7_1_ = true;
  }
  else {
    for (; potential_parent_local != (ImGuiWindow *)0x0;
        potential_parent_local = potential_parent_local->ParentWindow) {
      if (potential_parent_local == potential_parent) {
        return true;
      }
    }
    window_local._7_1_ = false;
  }
  return window_local._7_1_;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent)
{
    if (window->RootWindow == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        window = window->ParentWindow;
    }
    return false;
}